

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Detail::anon_unknown_0::DebugOutStream::DebugOutStream(DebugOutStream *this)

{
  StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL> *this_00;
  pointer pSVar1;
  DebugOutStream *this_local;
  
  IStream::IStream(&this->super_IStream);
  (this->super_IStream)._vptr_IStream = (_func_int **)&PTR__DebugOutStream_00d4dd18;
  this_00 = (StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL> *)
            operator_new(0x148);
  StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>::StreamBufImpl
            (this_00);
  std::
  unique_ptr<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,256ul>,std::default_delete<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,256ul>>>
  ::
  unique_ptr<std::default_delete<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,256ul>>,void>
            ((unique_ptr<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,256ul>,std::default_delete<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,256ul>>>
              *)&this->m_streamBuf,this_00);
  pSVar1 = clara::std::
           unique_ptr<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>,_std::default_delete<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>_>_>
           ::get(&this->m_streamBuf);
  std::ostream::ostream(&this->m_os,&pSVar1->super_streambuf);
  return;
}

Assistant:

DebugOutStream()
            : m_streamBuf(new StreamBufImpl<OutputDebugWriter>())
            , m_os(m_streamBuf.get()) {
        }